

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O0

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,string *h,int p)

{
  long lVar1;
  network_error *this_00;
  allocator<char> local_51;
  string local_50;
  int local_1c;
  string *psStack_18;
  int p_local;
  string *h_local;
  Impl *this_local;
  
  local_1c = p;
  psStack_18 = h;
  h_local = (string *)this;
  boost::optional<sockaddr_in>::optional(&this->sa);
  std::__cxx11::string::string((string *)&this->host,(string *)psStack_18);
  this->port = local_1c;
  lVar1 = std::__cxx11::string::find_first_of((char *)psStack_18,0x21f830);
  if (lVar1 != -1) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Hostname must not contain CR LF characters",&local_51);
    network_error::network_error(this_00,&local_50,false,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return;
}

Assistant:

Inet_addr::Impl::Impl( const std::string& h, int p ):
  sa(), host(h), port(p)
{
  if (h.find_first_of("\n\r") != std::string::npos)
    throw network_error("Hostname must not contain CR LF characters", false);
}